

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geodesic.cpp
# Opt level: O3

void deleteEmptyEdges(vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *v)

{
  pointer pPVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  pointer pPVar5;
  iterator __first;
  
  pPVar5 = (v->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pPVar1 = (v->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar3 = (long)pPVar1 - (long)pPVar5;
  lVar4 = (lVar3 >> 3) * -0x71c71c71c71c71c7 >> 2;
  if (0 < lVar4) {
    lVar4 = lVar4 + 1;
    do {
      bVar2 = Bipartition::isEmpty(&pPVar5->super_Bipartition);
      __first._M_current = pPVar5;
      if (bVar2) goto LAB_00119aa6;
      bVar2 = Bipartition::isEmpty(&pPVar5[1].super_Bipartition);
      __first._M_current = pPVar5 + 1;
      if (bVar2) goto LAB_00119aa6;
      bVar2 = Bipartition::isEmpty(&pPVar5[2].super_Bipartition);
      __first._M_current = pPVar5 + 2;
      if (bVar2) goto LAB_00119aa6;
      bVar2 = Bipartition::isEmpty(&pPVar5[3].super_Bipartition);
      __first._M_current = pPVar5 + 3;
      if (bVar2) goto LAB_00119aa6;
      pPVar5 = pPVar5 + 4;
      lVar4 = lVar4 + -1;
      lVar3 = lVar3 + -0x120;
    } while (1 < lVar4);
  }
  lVar3 = (lVar3 >> 3) * -0x71c71c71c71c71c7;
  if (lVar3 == 1) {
LAB_00119a95:
    bVar2 = Bipartition::isEmpty(&pPVar5->super_Bipartition);
    __first._M_current = pPVar5;
    if (!bVar2) {
      __first._M_current = pPVar1;
    }
  }
  else if (lVar3 == 2) {
LAB_00119a85:
    bVar2 = Bipartition::isEmpty(&pPVar5->super_Bipartition);
    __first._M_current = pPVar5;
    if (!bVar2) {
      pPVar5 = pPVar5 + 1;
      goto LAB_00119a95;
    }
  }
  else {
    __first._M_current = pPVar1;
    if (lVar3 != 3) goto LAB_00119b16;
    bVar2 = Bipartition::isEmpty(&pPVar5->super_Bipartition);
    __first._M_current = pPVar5;
    if (!bVar2) {
      pPVar5 = pPVar5 + 1;
      goto LAB_00119a85;
    }
  }
LAB_00119aa6:
  pPVar5 = __first._M_current + 1;
  if (pPVar5 != pPVar1 && __first._M_current != pPVar1) {
    do {
      bVar2 = Bipartition::isEmpty(&pPVar5->super_Bipartition);
      if (!bVar2) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&((__first._M_current)->super_Bipartition).partition.m_bits,
                   &(pPVar5->super_Bipartition).partition.m_bits);
        ((__first._M_current)->super_Bipartition).partition.m_num_bits =
             (pPVar5->super_Bipartition).partition.m_num_bits;
        (__first._M_current)->length = pPVar5->length;
        ((__first._M_current)->originalEdge).
        super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (pPVar5->originalEdge).super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&((__first._M_current)->originalEdge).
                    super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   &(pPVar5->originalEdge).
                    super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        (__first._M_current)->originalID = pPVar5->originalID;
        __first._M_current = __first._M_current + 1;
      }
      pPVar5 = pPVar5 + 1;
    } while (pPVar5 != pPVar1);
  }
LAB_00119b16:
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::_M_erase
            (v,__first,
             (v->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void deleteEmptyEdges(vector<PhyloTreeEdge> &v) {
    v.erase(std::remove_if(v.begin(), v.end(), [](PhyloTreeEdge &element) {
        return element.isEmpty();
    }), v.end());
}